

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<std::vector<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>,_std::unique_ptr<std::vector<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>,_std::default_delete<std::vector<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>_>_>_>
* __thiscall
pybind11::
class_<std::vector<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::allocator<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>,std::unique_ptr<std::vector<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::allocator<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>,std::default_delete<std::vector<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::allocator<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>>>
::
def<unsigned_long(std::vector<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::allocator<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>::*)()const>
          (class_<std::vector<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>,_std::unique_ptr<std::vector<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>,_std::default_delete<std::vector<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>_>_>_>
           *this,char *name_,
          offset_in_vector<unsigned_long,_std::allocator<unsigned_long>_>_to_subr *f)

{
  sibling *this_00;
  undefined8 *in_RDX;
  is_method *extraout_RDX;
  none *in_RSI;
  handle *in_RDI;
  cpp_function *in_stack_00000010;
  char *in_stack_00000018;
  object *in_stack_00000020;
  cpp_function cf;
  is_method *extra_1;
  char *in_stack_ffffffffffffff78;
  handle in_stack_ffffffffffffff80;
  handle in_stack_ffffffffffffff88;
  offset_in_vector<unsigned_long,_std::allocator<unsigned_long>_>_to_subr in_stack_ffffffffffffff90;
  cpp_function *local_68;
  is_method local_40;
  name local_38;
  void *local_30;
  offset_in_vector<unsigned_long,_std::allocator<unsigned_long>_>_to_subr local_28;
  none *local_10;
  
  local_30 = (void *)*in_RDX;
  local_28 = in_RDX[1];
  local_10 = in_RSI;
  this_00 = (sibling *)
            _std__vector<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::allocator<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>___pybind11__method_adaptor<std::vector<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::allocator<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>,unsigned_long,std::vector<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::allocator<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>>_unsigned_long_std__vector<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::allocator<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>______const__
                      (local_30,local_28);
  extra_1 = extraout_RDX;
  pybind11::name::name(&local_38,(char *)local_10);
  is_method::is_method(&local_40,in_RDI);
  none::none(local_10);
  getattr(in_stack_ffffffffffffff88,in_stack_ffffffffffffff78,in_stack_ffffffffffffff80);
  sibling::sibling(this_00,&extra_1->class_);
  cpp_function::
  cpp_function<unsigned_long,std::vector<std::vector<PerfectMatch,std::allocator<PerfectMatch>>,std::allocator<std::vector<PerfectMatch,std::allocator<PerfectMatch>>>>,,pybind11::name,pybind11::is_method,pybind11::sibling>
            (local_68,in_stack_ffffffffffffff90,(name *)in_stack_ffffffffffffff88.m_ptr,extra_1,
             this_00);
  object::~object((object *)0x320a13);
  none::~none((none *)0x320a1d);
  pybind11::detail::add_class_method(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  cpp_function::~cpp_function((cpp_function *)0x320a46);
  return (class_<std::vector<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>,_std::unique_ptr<std::vector<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>,_std::default_delete<std::vector<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>_>_>_>
          *)in_RDI;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }